

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O0

int pcap_setnonblock_fd(pcap_t *p,int nonblock,char *errbuf)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint local_2c;
  int fdflags;
  char *errbuf_local;
  int nonblock_local;
  pcap_t *p_local;
  
  local_2c = fcntl(p->fd,3,0);
  if (local_2c == 0xffffffff) {
    piVar2 = __errno_location();
    pcVar3 = pcap_strerror(*piVar2);
    snprintf(errbuf,0x100,"F_GETFL: %s",pcVar3);
    p_local._4_4_ = -1;
  }
  else {
    if (nonblock == 0) {
      local_2c = local_2c & 0xfffff7ff;
    }
    else {
      local_2c = local_2c | 0x800;
    }
    iVar1 = fcntl(p->fd,4,(ulong)local_2c);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      pcVar3 = pcap_strerror(*piVar2);
      snprintf(errbuf,0x100,"F_SETFL: %s",pcVar3);
      p_local._4_4_ = -1;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int
pcap_setnonblock_fd(pcap_t *p, int nonblock, char *errbuf)
{
	int fdflags;

	fdflags = fcntl(p->fd, F_GETFL, 0);
	if (fdflags == -1) {
		pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE, "F_GETFL: %s",
		    pcap_strerror(errno));
		return (-1);
	}
	if (nonblock)
		fdflags |= O_NONBLOCK;
	else
		fdflags &= ~O_NONBLOCK;
	if (fcntl(p->fd, F_SETFL, fdflags) == -1) {
		pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE, "F_SETFL: %s",
		    pcap_strerror(errno));
		return (-1);
	}
	return (0);
}